

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Vec_Ptr_t * Aig_ManRegPartitionTraverse(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  Vec_Ptr_t *vLos_00;
  Aig_Obj_t *pAVar6;
  uint local_2c;
  int local_28;
  int Counter;
  int nPrev;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vLos;
  Aig_Man_t *p_local;
  
  for (Counter = 0; iVar1 = Vec_PtrSize(p->vCis), Counter < iVar1; Counter = Counter + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,Counter);
    *(int *)((long)pvVar5 + 0x28) = Counter;
  }
  iVar1 = Aig_ManRegNum(p);
  vLos_00 = Vec_PtrAlloc(iVar1);
  local_28 = 0;
  local_2c = 0;
  Aig_ManIncrementTravId(p);
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (Counter = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), Counter < iVar1; Counter = Counter + 1
      ) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Counter);
    local_2c = local_2c + 1;
    printf("Latch %d: ",(ulong)local_2c);
    pAVar6 = Aig_ObjFanin0(pAVar6);
    Aig_ManRegPartitionTraverse_rec(p,pAVar6,vLos_00);
    iVar1 = Vec_PtrSize(vLos_00);
    printf("%d=%d \n",(ulong)local_2c,(ulong)(uint)(iVar1 - local_28));
    local_28 = Vec_PtrSize(vLos_00);
  }
  uVar3 = Vec_PtrSize(vLos_00);
  uVar4 = Aig_ManRegNum(p);
  printf("Total collected = %d. Total regs = %d.\n",(ulong)uVar3,(ulong)uVar4);
  return vLos_00;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionTraverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vLos;
    Aig_Obj_t * pObj;
    int i, nPrev, Counter;
    // mark the registers
    Aig_ManForEachCi( p, pObj, i )
       pObj->iData = i; 
    // collect registers
    vLos = Vec_PtrAlloc( Aig_ManRegNum(p) );
    nPrev = 0;
    Counter = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        ++Counter;
        printf( "Latch %d: ", Counter );
        Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
printf( "%d=%d \n", Counter, Vec_PtrSize(vLos)-nPrev );
        nPrev = Vec_PtrSize(vLos);
    }
    printf( "Total collected = %d. Total regs = %d.\n", Vec_PtrSize(vLos), Aig_ManRegNum(p) );
    return vLos;
}